

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CFG::preds(CFG *this,uint32_t blk_id)

{
  size_type sVar1;
  mapped_type *pmVar2;
  uint32_t local_14;
  CFG *pCStack_10;
  uint32_t blk_id_local;
  CFG *this_local;
  
  local_14 = blk_id;
  pCStack_10 = this;
  sVar1 = std::
          unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::count(&this->label2preds_,&local_14);
  if (sVar1 != 0) {
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::at(&this->label2preds_,&local_14);
    return pmVar2;
  }
  __assert_fail("label2preds_.count(blk_id)",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/cfg.h"
                ,0x24,"const std::vector<uint32_t> &spvtools::opt::CFG::preds(uint32_t) const");
}

Assistant:

const std::vector<uint32_t>& preds(uint32_t blk_id) const {
    assert(label2preds_.count(blk_id));
    return label2preds_.at(blk_id);
  }